

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

void __thiscall Bstrlib::CBString::insertchrs(CBString *this,int pos,int len,uchar cfill)

{
  int iVar1;
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  iVar1 = binsertch(&this->super_tagbstring,pos,len,cfill);
  if (iVar1 != -1) {
    return;
  }
  std::__cxx11::string::string((string *)&local_58,"CBString::Failure in insertchrs",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::insertchrs (int pos, int len, unsigned char cfill) {
	if (BSTR_ERR == binsertch (this, pos, len, cfill)) {
		bstringThrow ("Failure in insertchrs");
	}
}